

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::CurrentProgramBindingTestCase::test
          (CurrentProgramBindingTestCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TestLog *pTVar1;
  GLuint shader;
  GLenum GVar2;
  GLuint shader_00;
  GLuint program;
  allocator<char> local_101;
  ScopedLogSection section_1;
  string local_f8;
  string local_d8;
  ScopedLogSection section;
  GLint compileStatus;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  CurrentProgramBindingTestCase *local_50;
  GLint linkStatus;
  code *local_40;
  GLenum local_38;
  
  pTVar1 = gl->m_log;
  local_50 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Initial",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Initial",(allocator<char> *)&local_70);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar1,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8b8d,0,(local_50->super_BindingTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar1 = gl->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"VertexShader",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Vertex Shader",(allocator<char> *)&local_90);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  shader = glu::CallLogWrapper::glCreateShader(gl,0x8b31);
  glu::CallLogWrapper::glShaderSource(gl,shader,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(gl,shader);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Got Error ",&local_101);
    local_40 = glu::getErrorName;
    local_38 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_90,&local_70);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_f8,&local_d8,"glCompileShader");
    tcu::ResultCollector::fail(result,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  glu::CallLogWrapper::glGetShaderiv(gl,shader,0x8b81,&compileStatus);
  if (compileStatus != 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"expected GL_TRUE",(allocator<char> *)&local_d8);
    tcu::ResultCollector::fail(result,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = gl->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"FragmentShader",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Fragment Shader",(allocator<char> *)&local_90);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  shader_00 = glu::CallLogWrapper::glCreateShader(gl,0x8b30);
  glu::CallLogWrapper::glShaderSource(gl,shader_00,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(gl,shader_00);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Got Error ",&local_101);
    local_40 = glu::getErrorName;
    local_38 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_90,&local_70);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_f8,&local_d8,"glCompileShader");
    tcu::ResultCollector::fail(result,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  glu::CallLogWrapper::glGetShaderiv(gl,shader_00,0x8b81,&compileStatus);
  if (compileStatus != 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"expected GL_TRUE",(allocator<char> *)&local_d8);
    tcu::ResultCollector::fail(result,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = gl->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Program",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Create and bind program",(allocator<char> *)&local_90);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  program = glu::CallLogWrapper::glCreateProgram(gl);
  glu::CallLogWrapper::glAttachShader(gl,program,shader);
  glu::CallLogWrapper::glAttachShader(gl,program,shader_00);
  glu::CallLogWrapper::glLinkProgram(gl,program);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Got Error ",&local_101);
    local_40 = glu::getErrorName;
    local_38 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_90,&local_70);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_f8,&local_d8,"glLinkProgram");
    tcu::ResultCollector::fail(result,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  glu::CallLogWrapper::glGetProgramiv(gl,program,0x8b82,&linkStatus);
  if (linkStatus != 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"expected GL_TRUE",(allocator<char> *)&local_d8);
    tcu::ResultCollector::fail(result,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  glu::CallLogWrapper::glUseProgram(gl,program);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Got Error ",&local_101);
    local_40 = glu::getErrorName;
    local_38 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_90,&local_70);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_f8,&local_d8,"glUseProgram");
    tcu::ResultCollector::fail(result,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8b8d,program,(local_50->super_BindingTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = gl->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Delete",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Delete program while in use",(allocator<char> *)&local_90);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  glu::CallLogWrapper::glDeleteShader(gl,shader);
  glu::CallLogWrapper::glDeleteShader(gl,shader_00);
  glu::CallLogWrapper::glDeleteProgram(gl,program);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Got Error ",&local_101);
    local_40 = glu::getErrorName;
    local_38 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_90,&local_70);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_f8,&local_d8,"glDeleteProgram");
    tcu::ResultCollector::fail(result,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8b8d,program,(local_50->super_BindingTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  pTVar1 = gl->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Unbind",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"Unbind program",(allocator<char> *)&local_90);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar1,&local_f8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  glu::CallLogWrapper::glUseProgram(gl,0);
  GVar2 = glu::CallLogWrapper::glGetError(gl);
  if (GVar2 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Got Error ",&local_101);
    local_40 = glu::getErrorName;
    local_38 = GVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   &local_90,&local_70);
    std::operator+(&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section,
                   ": ");
    std::operator+(&local_f8,&local_d8,"glUseProgram");
    tcu::ResultCollector::fail(result,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&section);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  deqp::gls::StateQueryUtil::verifyStateInteger
            (result,gl,0x8b8d,0,(local_50->super_BindingTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  return;
}

Assistant:

void test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
	{
		static const char* testVertSource =
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n";
		static const char* testFragSource =
			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(0.0);\n"
			"}\n";

		GLuint	shaderVert;
		GLuint	shaderFrag;
		GLuint	shaderProg;
		GLint	compileStatus;
		GLint	linkStatus;

		{
			const tcu::ScopedLogSection section(gl.getLog(), "Initial", "Initial");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, 0, m_type);
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "VertexShader", "Vertex Shader");

			shaderVert = gl.glCreateShader(GL_VERTEX_SHADER);
			gl.glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
			gl.glCompileShader(shaderVert);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glCompileShader");

			gl.glGetShaderiv(shaderVert, GL_COMPILE_STATUS, &compileStatus);
			if (compileStatus != GL_TRUE)
				result.fail("expected GL_TRUE");
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "FragmentShader", "Fragment Shader");

			shaderFrag = gl.glCreateShader(GL_FRAGMENT_SHADER);
			gl.glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);
			gl.glCompileShader(shaderFrag);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glCompileShader");

			gl.glGetShaderiv(shaderFrag, GL_COMPILE_STATUS, &compileStatus);
			if (compileStatus != GL_TRUE)
				result.fail("expected GL_TRUE");
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "Program", "Create and bind program");

			shaderProg = gl.glCreateProgram();
			gl.glAttachShader(shaderProg, shaderVert);
			gl.glAttachShader(shaderProg, shaderFrag);
			gl.glLinkProgram(shaderProg);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glLinkProgram");

			gl.glGetProgramiv(shaderProg, GL_LINK_STATUS, &linkStatus);
			if (linkStatus != GL_TRUE)
				result.fail("expected GL_TRUE");

			gl.glUseProgram(shaderProg);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glUseProgram");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, shaderProg, m_type);
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "Delete", "Delete program while in use");

			gl.glDeleteShader(shaderVert);
			gl.glDeleteShader(shaderFrag);
			gl.glDeleteProgram(shaderProg);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteProgram");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, shaderProg, m_type);
		}
		{
			const tcu::ScopedLogSection section(gl.getLog(), "Unbind", "Unbind program");
			gl.glUseProgram(0);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glUseProgram");

			verifyStateInteger(result, gl, GL_CURRENT_PROGRAM, 0, m_type);
		}
	}